

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::anon_unknown_133::dynamicCheckTestMessage<capnp::DynamicStruct::Reader>
               (Reader reader)

{
  double dVar1;
  DynamicEnum e;
  DynamicEnum e_00;
  bool result;
  int8_t iVar2;
  uint8_t uVar3;
  int16_t iVar4;
  uint16_t uVar5;
  int32_t iVar6;
  uint32_t uVar7;
  int64_t iVar8;
  uint64_t uVar9;
  char *pcVar10;
  size_type sVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  double dVar17;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  StringPtr name_60;
  StringPtr name_61;
  StringPtr name_62;
  initializer_list<capnp::Void> expected;
  StringPtr name_63;
  initializer_list<bool> expected_00;
  StringPtr name_64;
  initializer_list<signed_char> expected_01;
  StringPtr name_65;
  initializer_list<short> expected_02;
  StringPtr name_66;
  initializer_list<int> expected_03;
  StringPtr name_67;
  initializer_list<long> expected_04;
  StringPtr name_68;
  initializer_list<unsigned_char> expected_05;
  StringPtr name_69;
  initializer_list<unsigned_short> expected_06;
  StringPtr name_70;
  initializer_list<unsigned_int> expected_07;
  StringPtr name_71;
  initializer_list<unsigned_long> expected_08;
  StringPtr name_72;
  initializer_list<float> expected_09;
  StringPtr name_73;
  initializer_list<double> expected_10;
  StringPtr name_74;
  initializer_list<capnp::Text::Reader> expected_11;
  StringPtr name_75;
  initializer_list<capnp::Data::Reader> expected_12;
  StringPtr name_76;
  StringPtr name_77;
  StringPtr name_78;
  StringPtr name_79;
  StringPtr name_80;
  StringPtr name_81;
  StringPtr name_82;
  StringPtr name_83;
  initializer_list<const_char_*> expected_13;
  StringPtr name_84;
  StringPtr name_85;
  StringPtr name_86;
  StringPtr name_87;
  initializer_list<bool> expected_14;
  StringPtr name_88;
  initializer_list<signed_char> expected_15;
  StringPtr name_89;
  initializer_list<short> expected_16;
  StringPtr name_90;
  initializer_list<int> expected_17;
  StringPtr name_91;
  initializer_list<long> expected_18;
  StringPtr name_92;
  initializer_list<unsigned_char> expected_19;
  StringPtr name_93;
  initializer_list<unsigned_short> expected_20;
  StringPtr name_94;
  initializer_list<unsigned_int> expected_21;
  StringPtr name_95;
  initializer_list<unsigned_long> expected_22;
  StringPtr name_96;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_29;
  undefined8 uStack_910;
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition;
  undefined1 local_8e0;
  ReaderFor<capnp::DynamicStruct> subSubReader;
  DebugExpression<bool> _kjCondition_10;
  undefined1 auStack_87f [15];
  ArrayPtr<const_char> local_848;
  DebugExpression<bool> _kjCondition_23;
  undefined1 auStack_837 [15];
  char *local_800;
  DebugComparison<const_char_(&)[14],_capnp::Text::Reader> _kjCondition_27;
  Reader local_6f0;
  Reader local_6a8;
  Reader local_660;
  Reader local_618;
  Reader local_5d0;
  Reader local_588;
  Reader local_540;
  Reader local_4f8;
  Reader local_4b0;
  Reader local_468;
  Reader local_420;
  Reader local_3d8;
  Reader local_390;
  Reader local_348;
  Reader local_300;
  Reader local_2b8;
  Reader local_270;
  Reader local_228;
  Reader local_1e0;
  Reader local_198;
  Reader local_150;
  Reader local_108;
  Reader local_c0;
  Reader local_78;
  
  _kjCondition_27.right.super_StringPtr.content.ptr = *_kjCondition_27.left;
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0xca;
  _kjCondition.left._1_1_ = 0xad;
  _kjCondition.left._2_2_ = 0x2c;
  _kjCondition.left._4_1_ = 0;
  _kjCondition.left._5_1_ = 0;
  _kjCondition.left._6_2_ = 0;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = true;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_00.content.size_ = 10;
    name_00.content.ptr = "voidField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_00);
    DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x158,ERROR,
               "\"failed: expected \" \"(VOID) == (reader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, reader.get(\"voidField\").template as<Void>()"
               ,(char (*) [73])
                "failed: expected (VOID) == (reader.get(\"voidField\").template as<Void>())",
               &_kjCondition,(Void *)&VOID,(Void *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_01.content.size_ = 10;
  name_01.content.ptr = "boolField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_01);
  _kjCondition.left._1_1_ =
       DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 1;
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = _kjCondition.left._1_1_;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_1_ = 1;
    name_02.content.size_ = 10;
    name_02.content.ptr = "boolField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_02);
    _kjCondition_10.value =
         DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    kj::_::Debug::log<char_const(&)[73],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x159,ERROR,
               "\"failed: expected \" \"(true) == (reader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, true, reader.get(\"boolField\").template as<bool>()"
               ,(char (*) [73])
                "failed: expected (true) == (reader.get(\"boolField\").template as<bool>())",
               (DebugComparison<bool,_bool> *)&_kjCondition,(bool *)&subSubReader,
               &_kjCondition_10.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_03.content.size_ = 10;
  name_03.content.ptr = "int8Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_03);
  _kjCondition.left._4_1_ =
       DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0x85;
  _kjCondition.left._1_1_ = 0xff;
  _kjCondition.left._2_2_ = 0xffff;
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = _kjCondition.left._4_1_ == -0x7b;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xffffff85;
    name_04.content.size_ = 10;
    name_04.content.ptr = "int8Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_04);
    iVar2 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_29);
    _kjCondition_10.value = (bool)iVar2;
    kj::_::Debug::log<char_const(&)[75],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15a,ERROR,
               "\"failed: expected \" \"(-123) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, -123, reader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [75])
                "failed: expected (-123) == (reader.get(\"int8Field\").template as<int8_t>())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&subSubReader,
               &_kjCondition_10.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_05.content.size_ = 0xb;
  name_05.content.ptr = "int16Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_05);
  iVar4 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 199;
  _kjCondition.left._1_1_ = 0xcf;
  _kjCondition.left._2_2_ = 0xffff;
  _kjCondition.left._4_1_ = (uint8_t)iVar4;
  _kjCondition.left._5_1_ = (undefined1)((ushort)iVar4 >> 8);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = iVar4 == -0x3039;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xffffcfc7;
    name_06.content.size_ = 0xb;
    name_06.content.ptr = "int16Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_06);
    iVar4 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    __kjCondition_10 = iVar4;
    kj::_::Debug::log<char_const(&)[79],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15b,ERROR,
               "\"failed: expected \" \"(-12345) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, -12345, reader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [79])
                "failed: expected (-12345) == (reader.get(\"int16Field\").template as<int16_t>())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&subSubReader,
               (short *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_07.content.size_ = 0xb;
  name_07.content.ptr = "int32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_07);
  iVar6 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0xb2;
  _kjCondition.left._1_1_ = 0x9e;
  _kjCondition.left._2_2_ = 0xff43;
  _kjCondition.left._4_1_ = (uint8_t)iVar6;
  _kjCondition.left._5_1_ = (undefined1)((uint)iVar6 >> 8);
  _kjCondition.left._6_2_ = (undefined2)((uint)iVar6 >> 0x10);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = iVar6 == -0xbc614e;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xff439eb2;
    name_08.content.size_ = 0xb;
    name_08.content.ptr = "int32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_08);
    iVar6 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    __kjCondition_10 = iVar6;
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15c,ERROR,
               "\"failed: expected \" \"(-12345678) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, -12345678, reader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [82])
                "failed: expected (-12345678) == (reader.get(\"int32Field\").template as<int32_t>())"
               ,(DebugComparison<int,_int> *)&_kjCondition,(int *)&subSubReader,
               (int *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_09.content.size_ = 0xb;
  name_09.content.ptr = "int64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_09);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0x87;
  _kjCondition.left._1_1_ = 0x20;
  _kjCondition.left._2_2_ = 0x79f2;
  _kjCondition.left._4_1_ = 0xb7;
  _kjCondition.left._5_1_ = 0x8f;
  _kjCondition.left._6_2_ = 0xffff;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._8_8_ == -0x7048860ddf79;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw = (Schema)0xffff8fb779f22087;
    name_10.content.size_ = 0xb;
    name_10.content.ptr = "int64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_10);
    iVar8 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    __kjCondition_10 = (uchar *)iVar8;
    kj::_::Debug::log<char_const(&)[91],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15d,ERROR,
               "\"failed: expected \" \"(-123456789012345ll) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, -123456789012345ll, reader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [91])
                "failed: expected (-123456789012345ll) == (reader.get(\"int64Field\").template as<int64_t>())"
               ,(DebugComparison<long_long,_long> *)&_kjCondition,(longlong *)&subSubReader,
               (long *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_11.content.size_ = 0xb;
  name_11.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_11);
  _kjCondition.left._4_1_ =
       DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                 ((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0xea;
  _kjCondition.left._1_1_ = 0;
  _kjCondition.left._2_2_ = 0;
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = _kjCondition.left._4_1_ == 0xea;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xea;
    name_12.content.size_ = 0xb;
    name_12.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_12);
    uVar3 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_29);
    _kjCondition_10.value = (bool)uVar3;
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15e,ERROR,
               "\"failed: expected \" \"(234u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 234u, reader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [77])
                "failed: expected (234u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,(uint *)&subSubReader,
               &_kjCondition_10.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_13.content.size_ = 0xc;
  name_13.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_13);
  uVar5 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0x6e;
  _kjCondition.left._1_1_ = 0xb2;
  _kjCondition.left._2_2_ = 0;
  _kjCondition.left._4_1_ = (uint8_t)uVar5;
  _kjCondition.left._5_1_ = (undefined1)(uVar5 >> 8);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar5 == 0xb26e;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xb26e;
    name_14.content.size_ = 0xc;
    name_14.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_14);
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_29);
    __kjCondition_10 = uVar5;
    kj::_::Debug::
    log<char_const(&)[81],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15f,ERROR,
               "\"failed: expected \" \"(45678u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 45678u, reader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [81])
                "failed: expected (45678u) == (reader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,(uint *)&subSubReader
               ,(unsigned_short *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_15.content.size_ = 0xc;
  name_15.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_15);
  uVar7 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0x14;
  _kjCondition.left._1_1_ = 0x6a;
  _kjCondition.left._2_2_ = 0xce0a;
  _kjCondition.left._4_1_ = (uint8_t)uVar7;
  _kjCondition.left._5_1_ = (undefined1)(uVar7 >> 8);
  _kjCondition.left._6_2_ = (undefined2)(uVar7 >> 0x10);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar7 == 0xce0a6a14;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xce0a6a14;
    name_16.content.size_ = 0xc;
    name_16.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_16);
    uVar7 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_29);
    __kjCondition_10 = uVar7;
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x160,ERROR,
               "\"failed: expected \" \"(3456789012u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 3456789012u, reader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [86])
                "failed: expected (3456789012u) == (reader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&subSubReader,
               (uint *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_17.content.size_ = 0xc;
  name_17.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_17);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                 ((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0xd2;
  _kjCondition.left._1_1_ = 10;
  _kjCondition.left._2_2_ = 0xeb1f;
  _kjCondition.left._4_1_ = 0x8c;
  _kjCondition.left._5_1_ = 0xa9;
  _kjCondition.left._6_2_ = 0xab54;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._8_8_ == 0xab54a98ceb1f0ad2;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw = (Schema)0xab54a98ceb1f0ad2;
    name_18.content.size_ = 0xc;
    name_18.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_18);
    uVar9 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_29);
    __kjCondition_10 = (uchar *)uVar9;
    kj::_::Debug::
    log<char_const(&)[98],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x161,ERROR,
               "\"failed: expected \" \"(12345678901234567890ull) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 12345678901234567890ull, reader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [98])
                "failed: expected (12345678901234567890ull) == (reader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(DebugComparison<unsigned_long_long,_unsigned_long> *)&_kjCondition,
               (unsigned_long_long *)&subSubReader,(unsigned_long *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_19.content.size_ = 0xd;
  name_19.content.ptr = "float32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_19);
  fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  bVar12 = true;
  if ((fVar13 != 1234.5) || (NAN(fVar13))) {
    fVar14 = fVar13 + -1234.5;
    fVar16 = -fVar14;
    if (-fVar14 <= fVar14) {
      fVar16 = fVar14;
    }
    fVar14 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar14 = fVar13;
    }
    bVar12 = fVar16 < (fVar14 + 1234.5) * 1e-05;
  }
  _kjCondition_10.value = bVar12;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_20.content.size_ = 0xd;
    name_20.content.ptr = "float32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_20);
    fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    _kjCondition.left._0_1_ = SUB41(fVar13,0);
    _kjCondition.left._1_1_ = (undefined1)((uint)fVar13 >> 8);
    _kjCondition.left._2_2_ = (undefined2)((uint)fVar13 >> 0x10);
    subSubReader.schema.super_Schema.raw._0_4_ = 0x449a5000;
    kj::_::Debug::log<char_const(&)[101],kj::_::DebugExpression<bool>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x162,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 1234.5f)\", _kjCondition, reader.get(\"float32Field\").template as<float>(), 1234.5f"
               ,(char (*) [101])
                "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 1234.5f)"
               ,&_kjCondition_10,(float *)&_kjCondition,(float *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_21.content.size_ = 0xd;
  name_21.content.ptr = "float64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_21);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  bVar12 = true;
  if ((dVar1 != -1.23e+47) || (NAN(dVar1))) {
    dVar15 = dVar1 + 1.23e+47;
    dVar17 = -dVar15;
    if (-dVar15 <= dVar15) {
      dVar17 = dVar15;
    }
    dVar15 = -dVar1;
    if (-dVar1 <= dVar1) {
      dVar15 = dVar1;
    }
    bVar12 = dVar17 < (dVar15 + 1.23e+47) * 1e-12;
  }
  _kjCondition_10.value = bVar12;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_22.content.size_ = 0xd;
    name_22.content.ptr = "float64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_22);
    dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    _kjCondition.left._0_1_ = SUB81(dVar1,0);
    _kjCondition.left._1_1_ = (undefined1)((ulong)dVar1 >> 8);
    _kjCondition.left._2_2_ = (undefined2)((ulong)dVar1 >> 0x10);
    _kjCondition.left._4_1_ = (uint8_t)((ulong)dVar1 >> 0x20);
    _kjCondition.left._5_1_ = (undefined1)((ulong)dVar1 >> 0x28);
    _kjCondition.left._6_2_ = (undefined2)((ulong)dVar1 >> 0x30);
    subSubReader.schema.super_Schema.raw = (Schema)0xc9b58b82c0e0bb00;
    kj::_::Debug::log<char_const(&)[103],kj::_::DebugExpression<bool>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x163,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), -123e45)\", _kjCondition, reader.get(\"float64Field\").template as<double>(), -123e45"
               ,(char (*) [103])
                "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), -123e45)"
               ,&_kjCondition_10,(double *)&_kjCondition,(double *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  __kjCondition_10 = (uchar *)"foo";
  name_23.content.size_ = 10;
  name_23.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_23);
  subSubReader._0_16_ =
       DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_29);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_10,(Reader *)&subSubReader);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((bool)local_8e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_24.content.size_ = 10;
    name_24.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_24);
    subSubReader._0_16_ =
         DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                   ((Reader *)&_kjCondition_29);
    kj::_::Debug::
    log<char_const(&)[74],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"foo\", reader.get(\"textField\").template as<Text>()"
               ,(char (*) [74])
                "failed: expected (\"foo\") == (reader.get(\"textField\").template as<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [4])"foo",(Reader *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_25.content.size_ = 10;
  name_25.content.ptr = "dataField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_25);
  _kjCondition.op.content =
       (ArrayPtr<const_char>)
       DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_29);
  if (_kjCondition.op.content.size_ == 3) {
    bVar12 = (char)*(short *)((long)_kjCondition.op.content.ptr + 2) == 'r' &&
             *(short *)_kjCondition.op.content.ptr == 0x6162;
  }
  else {
    bVar12 = false;
  }
  _kjCondition.left._0_1_ = 0x57;
  _kjCondition.left._1_1_ = 0x98;
  _kjCondition.left._2_2_ = 0x29;
  _kjCondition.left._4_1_ = 0;
  _kjCondition.left._5_1_ = 0;
  _kjCondition.left._6_2_ = 0;
  _kjCondition._8_8_ = 3;
  _kjCondition._32_8_ = anon_var_dwarf_a9f8;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((!bVar12) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.reader.segment = (SegmentReader *)0x3;
    subSubReader.schema.super_Schema.raw =
         (Schema)(Schema)((long)
                          "\"failed: expected \" \"(\\\"foo\\\") == (bar)\", _kjCondition, \"foo\", bar"
                         + 0x3f);
    name_26.content.size_ = 10;
    name_26.content.ptr = "dataField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_26);
    __kjCondition_10 =
         (ArrayPtr<const_unsigned_char>)
         DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                   ((Reader *)&_kjCondition_29);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x165,ERROR,
               "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"bar\"), reader.get(\"dataField\").template as<Data>()"
               ,(char (*) [80])
                "failed: expected (data(\"bar\")) == (reader.get(\"dataField\").template as<Data>())"
               ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
               (Reader *)&subSubReader,(Reader *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_27.content.size_ = 0xc;
  name_27.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_27);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&_kjCondition_10,(Reader *)&_kjCondition_29);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  name_28.content.size_ = 10;
  name_28.content.ptr = "voidField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_28);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0xca;
  _kjCondition.left._1_1_ = 0xad;
  _kjCondition.left._2_2_ = 0x2c;
  _kjCondition.left._4_1_ = 0;
  _kjCondition.left._5_1_ = 0;
  _kjCondition.left._6_2_ = 0;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = true;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_29.content.size_ = 10;
    name_29.content.ptr = "voidField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_29);
    DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    kj::_::Debug::
    log<char_const(&)[76],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"(VOID) == (subReader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, subReader.get(\"voidField\").template as<Void>()"
               ,(char (*) [76])
                "failed: expected (VOID) == (subReader.get(\"voidField\").template as<Void>())",
               &_kjCondition,(Void *)&VOID,(Void *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_30.content.size_ = 10;
  name_30.content.ptr = "boolField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_30);
  _kjCondition.left._1_1_ =
       DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 1;
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = _kjCondition.left._1_1_;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_1_ = 1;
    name_31.content.size_ = 10;
    name_31.content.ptr = "boolField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_31);
    _kjCondition_23.value =
         DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    kj::_::Debug::log<char_const(&)[76],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x169,ERROR,
               "\"failed: expected \" \"(true) == (subReader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, true, subReader.get(\"boolField\").template as<bool>()"
               ,(char (*) [76])
                "failed: expected (true) == (subReader.get(\"boolField\").template as<bool>())",
               (DebugComparison<bool,_bool> *)&_kjCondition,(bool *)&subSubReader,
               &_kjCondition_23.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_32.content.size_ = 10;
  name_32.content.ptr = "int8Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_32);
  _kjCondition.left._4_1_ =
       DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0xf4;
  _kjCondition.left._1_1_ = 0xff;
  _kjCondition.left._2_2_ = 0xffff;
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = _kjCondition.left._4_1_ == -0xc;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xfffffff4;
    name_33.content.size_ = 10;
    name_33.content.ptr = "int8Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_33);
    iVar2 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_29);
    _kjCondition_23.value = (bool)iVar2;
    kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16a,ERROR,
               "\"failed: expected \" \"(-12) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, -12, subReader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [77])
                "failed: expected (-12) == (subReader.get(\"int8Field\").template as<int8_t>())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&subSubReader,
               &_kjCondition_23.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_34.content.size_ = 0xb;
  name_34.content.ptr = "int16Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_34);
  iVar4 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0x80;
  _kjCondition.left._1_1_ = 0xd;
  _kjCondition.left._2_2_ = 0;
  _kjCondition.left._4_1_ = (uint8_t)iVar4;
  _kjCondition.left._5_1_ = (undefined1)((ushort)iVar4 >> 8);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = iVar4 == 0xd80;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xd80;
    name_35.content.size_ = 0xb;
    name_35.content.ptr = "int16Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_35);
    iVar4 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    __kjCondition_23 = iVar4;
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16b,ERROR,
               "\"failed: expected \" \"(3456) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, 3456, subReader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [80])
                "failed: expected (3456) == (subReader.get(\"int16Field\").template as<int16_t>())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&subSubReader,
               (short *)&_kjCondition_23);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_36.content.size_ = 0xb;
  name_36.content.ptr = "int32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_36);
  iVar6 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0xe;
  _kjCondition.left._1_1_ = 0x10;
  _kjCondition.left._2_2_ = 0xfb4c;
  _kjCondition.left._4_1_ = (uint8_t)iVar6;
  _kjCondition.left._5_1_ = (undefined1)((uint)iVar6 >> 8);
  _kjCondition.left._6_2_ = (undefined2)((uint)iVar6 >> 0x10);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = iVar6 == -0x4b3eff2;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xfb4c100e;
    name_37.content.size_ = 0xb;
    name_37.content.ptr = "int32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_37);
    iVar6 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    __kjCondition_23 = iVar6;
    kj::_::Debug::log<char_const(&)[85],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16c,ERROR,
               "\"failed: expected \" \"(-78901234) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, -78901234, subReader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [85])
                "failed: expected (-78901234) == (subReader.get(\"int32Field\").template as<int32_t>())"
               ,(DebugComparison<int,_int> *)&_kjCondition,(int *)&subSubReader,
               (int *)&_kjCondition_23);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_38.content.size_ = 0xb;
  name_38.content.ptr = "int64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_38);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0x4e;
  _kjCondition.left._1_1_ = 0x73;
  _kjCondition.left._2_2_ = 0x38e8;
  _kjCondition.left._4_1_ = 0xa6;
  _kjCondition.left._5_1_ = 0x33;
  _kjCondition.left._6_2_ = 0;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._8_8_ == 0x33a638e8734e;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw = (Schema)0x33a638e8734e;
    name_39.content.size_ = 0xb;
    name_39.content.ptr = "int64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_39);
    pcVar10 = (char *)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply
                                ((Reader *)&_kjCondition_29);
    __kjCondition_23 = (uchar *)pcVar10;
    kj::_::Debug::log<char_const(&)[92],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16d,ERROR,
               "\"failed: expected \" \"(56789012345678ll) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, 56789012345678ll, subReader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [92])
                "failed: expected (56789012345678ll) == (subReader.get(\"int64Field\").template as<int64_t>())"
               ,(DebugComparison<long_long,_long> *)&_kjCondition,(longlong *)&subSubReader,
               (long *)&_kjCondition_23);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_40.content.size_ = 0xb;
  name_40.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_40);
  _kjCondition.left._4_1_ =
       DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                 ((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0x5a;
  _kjCondition.left._1_1_ = 0;
  _kjCondition.left._2_2_ = 0;
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = _kjCondition.left._4_1_ == 'Z';
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0x5a;
    name_41.content.size_ = 0xb;
    name_41.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_41);
    uVar3 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_29);
    _kjCondition_23.value = (bool)uVar3;
    kj::_::Debug::
    log<char_const(&)[79],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16e,ERROR,
               "\"failed: expected \" \"(90u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 90u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [79])
                "failed: expected (90u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,(uint *)&subSubReader,
               &_kjCondition_23.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_42.content.size_ = 0xc;
  name_42.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_42);
  uVar5 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0xd2;
  _kjCondition.left._1_1_ = 4;
  _kjCondition.left._2_2_ = 0;
  _kjCondition.left._4_1_ = (uint8_t)uVar5;
  _kjCondition.left._5_1_ = (undefined1)(uVar5 >> 8);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar5 == 0x4d2;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0x4d2;
    name_43.content.size_ = 0xc;
    name_43.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_43);
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_29);
    __kjCondition_23 = uVar5;
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16f,ERROR,
               "\"failed: expected \" \"(1234u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 1234u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [83])
                "failed: expected (1234u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,(uint *)&subSubReader
               ,(unsigned_short *)&_kjCondition_23);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_44.content.size_ = 0xc;
  name_44.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_44);
  uVar7 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0x14;
  _kjCondition.left._1_1_ = 0x88;
  _kjCondition.left._2_2_ = 0x362;
  _kjCondition.left._4_1_ = (uint8_t)uVar7;
  _kjCondition.left._5_1_ = (undefined1)(uVar7 >> 8);
  _kjCondition.left._6_2_ = (undefined2)(uVar7 >> 0x10);
  _kjCondition._8_8_ = anon_var_dwarf_a9f8;
  _kjCondition.op.content.size_._0_1_ = uVar7 == 0x3628814;
  _kjCondition.op.content.ptr = &DAT_00000005;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0x3628814;
    name_45.content.size_ = 0xc;
    name_45.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_45);
    uVar7 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_29);
    __kjCondition_23 = uVar7;
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x170,ERROR,
               "\"failed: expected \" \"(56789012u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 56789012u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [87])
                "failed: expected (56789012u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&subSubReader,
               (uint *)&_kjCondition_23);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_46.content.size_ = 0xc;
  name_46.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_46);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                 ((Reader *)&_kjCondition_29);
  _kjCondition.left._0_1_ = 0xd2;
  _kjCondition.left._1_1_ = 10;
  _kjCondition.left._2_2_ = 0x126f;
  _kjCondition.left._4_1_ = 0x21;
  _kjCondition.left._5_1_ = 0x19;
  _kjCondition.left._6_2_ = 0x4cc;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = _kjCondition._8_8_ == 0x4cc1921126f0ad2;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw = (Schema)0x4cc1921126f0ad2;
    name_47.content.size_ = 0xc;
    name_47.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_47);
    pcVar10 = (char *)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                ((Reader *)&_kjCondition_29);
    __kjCondition_23 = (uchar *)pcVar10;
    kj::_::Debug::
    log<char_const(&)[99],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x171,ERROR,
               "\"failed: expected \" \"(345678901234567890ull) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 345678901234567890ull, subReader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [99])
                "failed: expected (345678901234567890ull) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(DebugComparison<unsigned_long_long,_unsigned_long> *)&_kjCondition,
               (unsigned_long_long *)&subSubReader,(unsigned_long *)&_kjCondition_23);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_48.content.size_ = 0xd;
  name_48.content.ptr = "float32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_48);
  fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  bVar12 = true;
  if ((fVar13 != -1.25e-10) || (NAN(fVar13))) {
    fVar14 = fVar13 + 1.25e-10;
    fVar16 = -fVar14;
    if (-fVar14 <= fVar14) {
      fVar16 = fVar14;
    }
    fVar14 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar14 = fVar13;
    }
    bVar12 = fVar16 < (fVar14 + 1.25e-10) * 1e-05;
  }
  _kjCondition_23.value = bVar12;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition_23.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_49.content.size_ = 0xd;
    name_49.content.ptr = "float32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_49);
    fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    _kjCondition.left._0_1_ = SUB41(fVar13,0);
    _kjCondition.left._1_1_ = (undefined1)((uint)fVar13 >> 8);
    _kjCondition.left._2_2_ = (undefined2)((uint)fVar13 >> 0x10);
    subSubReader.schema.super_Schema.raw._0_4_ = 0xaf09705f;
    kj::_::Debug::log<char_const(&)[107],kj::_::DebugExpression<bool>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x172,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), -1.25e-10f)\", _kjCondition, subReader.get(\"float32Field\").template as<float>(), -1.25e-10f"
               ,(char (*) [107])
                "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), -1.25e-10f)"
               ,&_kjCondition_23,(float *)&_kjCondition,(float *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_50.content.size_ = 0xd;
  name_50.content.ptr = "float64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_50);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
  bVar12 = true;
  if ((dVar1 != 345.0) || (NAN(dVar1))) {
    dVar15 = dVar1 + -345.0;
    dVar17 = -dVar15;
    if (-dVar15 <= dVar15) {
      dVar17 = dVar15;
    }
    dVar15 = -dVar1;
    if (-dVar1 <= dVar1) {
      dVar15 = dVar1;
    }
    bVar12 = dVar17 < (dVar15 + 345.0) * 1e-12;
  }
  _kjCondition_23.value = bVar12;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((_kjCondition_23.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_51.content.size_ = 0xd;
    name_51.content.ptr = "float64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_51);
    dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_29);
    _kjCondition.left._0_1_ = SUB81(dVar1,0);
    _kjCondition.left._1_1_ = (undefined1)((ulong)dVar1 >> 8);
    _kjCondition.left._2_2_ = (undefined2)((ulong)dVar1 >> 0x10);
    _kjCondition.left._4_1_ = (uint8_t)((ulong)dVar1 >> 0x20);
    _kjCondition.left._5_1_ = (undefined1)((ulong)dVar1 >> 0x28);
    _kjCondition.left._6_2_ = (undefined2)((ulong)dVar1 >> 0x30);
    subSubReader.schema.super_Schema.raw._0_4_ = 0x159;
    kj::_::Debug::log<char_const(&)[102],kj::_::DebugExpression<bool>&,double,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x173,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 345)\", _kjCondition, subReader.get(\"float64Field\").template as<double>(), 345"
               ,(char (*) [102])
                "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 345)"
               ,&_kjCondition_23,(double *)&_kjCondition,(int *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  __kjCondition_23 = "baz";
  name_52.content.size_ = 10;
  name_52.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_52);
  subSubReader._0_16_ =
       DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_29);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_23,(Reader *)&subSubReader);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  name_53.content.size_ = 10;
  name_53.content.ptr = "dataField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_53);
  _kjCondition.op.content =
       (ArrayPtr<const_char>)
       DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_29);
  if (_kjCondition.op.content.size_ == 3) {
    bVar12 = (char)*(short *)((long)_kjCondition.op.content.ptr + 2) == 'x' &&
             *(short *)_kjCondition.op.content.ptr == 0x7571;
  }
  else {
    bVar12 = false;
  }
  _kjCondition.left._0_1_ = 0x21;
  _kjCondition.left._1_1_ = 0x7c;
  _kjCondition.left._2_2_ = 0x2a;
  _kjCondition.left._4_1_ = 0;
  _kjCondition.left._5_1_ = 0;
  _kjCondition.left._6_2_ = 0;
  _kjCondition._8_8_ = 3;
  _kjCondition._32_8_ = anon_var_dwarf_a9f8;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  if ((!bVar12) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.reader.segment = (SegmentReader *)0x3;
    subSubReader.schema.super_Schema.raw = (Schema)(Schema)((long)"bazqux" + 3);
    name_54.content.size_ = 10;
    name_54.content.ptr = "dataField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_54);
    __kjCondition_23 =
         (ArrayPtr<const_unsigned_char>)
         DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                   ((Reader *)&_kjCondition_29);
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x175,ERROR,
               "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"qux\"), subReader.get(\"dataField\").template as<Data>()"
               ,(char (*) [83])
                "failed: expected (data(\"qux\")) == (subReader.get(\"dataField\").template as<Data>())"
               ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
               (Reader *)&subSubReader,(Reader *)&_kjCondition_23);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  }
  name_55.content.size_ = 0xc;
  name_55.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_55);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&subSubReader,(Reader *)&_kjCondition_29);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  _kjCondition_27.left = (char (*) [14])0x2b06d5;
  name_56.content.size_ = 10;
  name_56.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&subSubReader,name_56);
  __kjCondition_23 =
       (ArrayPtr<const_unsigned_char>)
       DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_29);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[7]> *)&_kjCondition_27,(Reader *)&_kjCondition_23);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  local_800 = "really nested";
  name_57.content.size_ = 0xc;
  name_57.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition,&subSubReader,name_57);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
  name_58.content.size_ = 10;
  name_58.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_23,name_58);
  local_848 = (ArrayPtr<const_char>)
              DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                        ((Reader *)&_kjCondition_29);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            (&_kjCondition_27,(DebugExpression<char_const(&)[14]> *)&local_800,(Reader *)&local_848)
  ;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  if ((_kjCondition_27.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_59.content.size_ = 0xc;
    name_59.content.ptr = "structField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition,&subSubReader,name_59);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
    name_60.content.size_ = 10;
    name_60.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_23,name_60);
    local_848 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&_kjCondition_29);
    kj::_::Debug::
    log<char_const(&)[139],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Reader>&,char_const(&)[14],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x17a,ERROR,
               "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"really nested\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
               ,(char (*) [139])
                "failed: expected (\"really nested\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
               ,&_kjCondition_27,(char (*) [14])"really nested",(Reader *)&local_848);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  }
  __kjCondition_23 = (uchar *)"baz";
  name_61.content.size_ = 10;
  name_61.content.ptr = "enumField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_61);
  DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
            ((Reader *)&_kjCondition_29);
  e.value._0_1_ = _kjCondition.left._0_1_;
  e.schema.super_Schema.raw = (Schema)(Schema)uStack_910;
  e.value._1_1_ = _kjCondition.left._1_1_;
  e._10_2_ = _kjCondition.left._2_2_;
  e._12_1_ = _kjCondition.left._4_1_;
  e._13_1_ = _kjCondition.left._5_1_;
  e._14_2_ = _kjCondition.left._6_2_;
  subSubReader._0_16_ = anon_unknown_133::name(e);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_23,(Reader *)&subSubReader);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  name_62.content.size_ = 9;
  name_62.content.ptr = "voidList";
  sVar11 = 9;
  DynamicStruct::Reader::get(&local_78,(Reader *)&_kjCondition_10,name_62);
  expected._M_len = sVar11;
  expected._M_array = (iterator)0x3;
  checkList<capnp::Void,capnp::DynamicValue::Reader>
            ((_ *)&local_78,(Reader *)&_kjCondition_29,expected);
  DynamicValue::Reader::~Reader(&local_78);
  name_63.content.size_ = 9;
  name_63.content.ptr = "boolList";
  sVar11 = 9;
  DynamicStruct::Reader::get(&local_c0,(Reader *)&_kjCondition_10,name_63);
  _kjCondition_29._0_5_ = 0x101000100;
  expected_00._M_len = sVar11;
  expected_00._M_array = (iterator)&DAT_00000005;
  checkList<bool,capnp::DynamicValue::Reader>((_ *)&local_c0,(Reader *)&_kjCondition_29,expected_00)
  ;
  DynamicValue::Reader::~Reader(&local_c0);
  name_64.content.size_ = 9;
  name_64.content.ptr = "int8List";
  sVar11 = 9;
  DynamicStruct::Reader::get(&local_108,(Reader *)&_kjCondition_10,name_64);
  _kjCondition_29.left = 0x7f80de0c;
  expected_01._M_len = sVar11;
  expected_01._M_array = &DAT_00000004;
  checkList<signed_char,capnp::DynamicValue::Reader>
            ((_ *)&local_108,(Reader *)&_kjCondition_29,expected_01);
  DynamicValue::Reader::~Reader(&local_108);
  name_65.content.size_ = 10;
  name_65.content.ptr = "int16List";
  sVar11 = 10;
  DynamicStruct::Reader::get(&local_150,(Reader *)&_kjCondition_10,name_65);
  _kjCondition_29.left = 0xe9d204d2;
  _kjCondition_29.right = 0x7fff8000;
  expected_02._M_len = sVar11;
  expected_02._M_array = (iterator)&DAT_00000004;
  checkList<short,capnp::DynamicValue::Reader>
            ((_ *)&local_150,(Reader *)&_kjCondition_29,expected_02);
  DynamicValue::Reader::~Reader(&local_150);
  name_66.content.size_ = 10;
  name_66.content.ptr = "int32List";
  sVar11 = 10;
  DynamicStruct::Reader::get(&local_198,(Reader *)&_kjCondition_10,name_66);
  _kjCondition_29.left = 0xbc614e;
  _kjCondition_29.right = 0xfaa0d340;
  _kjCondition_29.op.content.ptr = (char *)0x7fffffff80000000;
  expected_03._M_len = sVar11;
  expected_03._M_array = (iterator)&DAT_00000004;
  checkList<int,capnp::DynamicValue::Reader>((_ *)&local_198,(Reader *)&_kjCondition_29,expected_03)
  ;
  DynamicValue::Reader::~Reader(&local_198);
  name_67.content.size_ = 10;
  name_67.content.ptr = "int64List";
  sVar11 = 10;
  DynamicStruct::Reader::get(&local_1e0,(Reader *)&_kjCondition_10,name_67);
  _kjCondition_29.op.content.size_ = 0x8000000000000000;
  _kjCondition_29.result = true;
  _kjCondition_29._25_7_ = 0x7fffffffffffff;
  _kjCondition_29.left = 0x860ddf79;
  _kjCondition_29.right = 0x7048;
  _kjCondition_29.op.content.ptr = (char *)0xfffd968afd13752e;
  expected_04._M_len = sVar11;
  expected_04._M_array = (iterator)&DAT_00000004;
  checkList<long,capnp::DynamicValue::Reader>
            ((_ *)&local_1e0,(Reader *)&_kjCondition_29,expected_04);
  DynamicValue::Reader::~Reader(&local_1e0);
  name_68.content.size_ = 10;
  name_68.content.ptr = "uInt8List";
  sVar11 = 10;
  DynamicStruct::Reader::get(&local_228,(Reader *)&_kjCondition_10,name_68);
  _kjCondition_29.left = 0xff00220c;
  expected_05._M_len = sVar11;
  expected_05._M_array = &DAT_00000004;
  checkList<unsigned_char,capnp::DynamicValue::Reader>
            ((_ *)&local_228,(Reader *)&_kjCondition_29,expected_05);
  DynamicValue::Reader::~Reader(&local_228);
  name_69.content.size_ = 0xb;
  name_69.content.ptr = "uInt16List";
  sVar11 = 0xb;
  DynamicStruct::Reader::get(&local_270,(Reader *)&_kjCondition_10,name_69);
  _kjCondition_29.left = 0x162e04d2;
  _kjCondition_29.right = 0xffff0000;
  expected_06._M_len = sVar11;
  expected_06._M_array = (iterator)&DAT_00000004;
  checkList<unsigned_short,capnp::DynamicValue::Reader>
            ((_ *)&local_270,(Reader *)&_kjCondition_29,expected_06);
  DynamicValue::Reader::~Reader(&local_270);
  name_70.content.size_ = 0xb;
  name_70.content.ptr = "uInt32List";
  sVar11 = 0xb;
  DynamicStruct::Reader::get(&local_2b8,(Reader *)&_kjCondition_10,name_70);
  _kjCondition_29.left = 0xbc614e;
  _kjCondition_29.right = 0x55f2cc0;
  _kjCondition_29.op.content.ptr = (char *)0xffffffff00000000;
  expected_07._M_len = sVar11;
  expected_07._M_array = (iterator)&DAT_00000004;
  checkList<unsigned_int,capnp::DynamicValue::Reader>
            ((_ *)&local_2b8,(Reader *)&_kjCondition_29,expected_07);
  DynamicValue::Reader::~Reader(&local_2b8);
  name_71.content.size_ = 0xb;
  name_71.content.ptr = "uInt64List";
  sVar11 = 0xb;
  DynamicStruct::Reader::get(&local_300,(Reader *)&_kjCondition_10,name_71);
  _kjCondition_29.op.content.size_ = 0;
  _kjCondition_29.result = true;
  _kjCondition_29._25_7_ = 0xffffffffffffff;
  _kjCondition_29.left = 0x860ddf79;
  _kjCondition_29.right = 0x7048;
  _kjCondition_29.op.content.ptr = (char *)0x2697502ec8ad2;
  expected_08._M_len = sVar11;
  expected_08._M_array = (iterator)&DAT_00000004;
  checkList<unsigned_long,capnp::DynamicValue::Reader>
            ((_ *)&local_300,(Reader *)&_kjCondition_29,expected_08);
  DynamicValue::Reader::~Reader(&local_300);
  name_72.content.size_ = 0xc;
  name_72.content.ptr = "float32List";
  sVar11 = 0xc;
  DynamicStruct::Reader::get(&local_348,(Reader *)&_kjCondition_10,name_72);
  _kjCondition_29.left = 0;
  _kjCondition_29.right = 0x4996b438;
  _kjCondition_29.op.content.ptr = (char *)0xfcf0bdc27cf0bdc2;
  _kjCondition_29.op.content.size_ = 0x82081cea02081cea;
  expected_09._M_len = sVar11;
  expected_09._M_array = (iterator)0x6;
  checkList<float,capnp::DynamicValue::Reader>
            ((_ *)&local_348,(Reader *)&_kjCondition_29,expected_09);
  DynamicValue::Reader::~Reader(&local_348);
  name_73.content.size_ = 0xc;
  name_73.content.ptr = "float64List";
  sVar11 = 0xc;
  DynamicStruct::Reader::get(&local_390,(Reader *)&_kjCondition_10,name_73);
  _kjCondition_29.op.content.size_ = 0x7f76c8e5ca239029;
  _kjCondition_29.result = true;
  _kjCondition_29._25_7_ = 0xff76c8e5ca2390;
  _kjCondition_29.left = 0;
  _kjCondition_29.right = 0;
  _kjCondition_29.op.content.ptr = (char *)0x42dc12218377de40;
  expected_10._M_len = sVar11;
  expected_10._M_array = (iterator)0x6;
  checkList<double,capnp::DynamicValue::Reader>
            ((_ *)&local_390,(Reader *)&_kjCondition_29,expected_10);
  DynamicValue::Reader::~Reader(&local_390);
  name_74.content.size_ = 9;
  name_74.content.ptr = "textList";
  sVar11 = 9;
  DynamicStruct::Reader::get(&local_3d8,(Reader *)&_kjCondition_10,name_74);
  _kjCondition_29._0_8_ = (long)"quxquux" + 3;
  _kjCondition_29.op.content.ptr = &DAT_00000005;
  _kjCondition_29.op.content.size_ = (size_t)anon_var_dwarf_b8c7e;
  _kjCondition_29.result = true;
  _kjCondition_29._25_7_ = 0;
  expected_11._M_len = sVar11;
  expected_11._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_3d8,(Reader *)&_kjCondition_29,expected_11);
  DynamicValue::Reader::~Reader(&local_3d8);
  name_75.content.size_ = 9;
  name_75.content.ptr = "dataList";
  sVar11 = 9;
  DynamicStruct::Reader::get(&local_420,(Reader *)&_kjCondition_10,name_75);
  _kjCondition_29._0_8_ = anon_var_dwarf_b954f;
  _kjCondition_29.op.content.ptr = (char *)0x6;
  _kjCondition_29.op.content.size_ = (size_t)anon_var_dwarf_b858a;
  _kjCondition_29.result = true;
  _kjCondition_29._25_7_ = 0;
  expected_12._M_len = sVar11;
  expected_12._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Reader>
            ((_ *)&local_420,(Reader *)&_kjCondition_29,expected_12);
  DynamicValue::Reader::~Reader(&local_420);
  name_76.content.size_ = 0xb;
  name_76.content.ptr = "structList";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_10,name_76);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&subSubReader,(Reader *)&_kjCondition_29);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
  _kjCondition_29.right = subSubReader.reader.dataSize;
  _kjCondition_29.left = 3;
  _kjCondition_29.op.content.ptr = " == ";
  _kjCondition_29.op.content.size_ = 5;
  _kjCondition_29.result = subSubReader.reader.dataSize == 3;
  if (subSubReader.reader.dataSize == 3) {
    local_800 = "x structlist 1";
    DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
    name_77.content.size_ = 10;
    name_77.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_23,name_77);
    local_848 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&_kjCondition_29);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_27,
               (DebugExpression<char_const(&)[15]> *)&local_800,(Reader *)&local_848);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    if ((_kjCondition_27.result == false) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,0);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
      name_78.content.size_ = 10;
      name_78.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_23,name_78);
      local_848 = (ArrayPtr<const_char>)
                  DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                            ((Reader *)&_kjCondition_29);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,400,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_27,
                 (char (*) [15])"x structlist 1",(Reader *)&local_848);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    }
    local_800 = "x structlist 2";
    DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
    name_79.content.size_ = 10;
    name_79.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_23,name_79);
    local_848 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&_kjCondition_29);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_27,
               (DebugExpression<char_const(&)[15]> *)&local_800,(Reader *)&local_848);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    if ((_kjCondition_27.result == false) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,1);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
      name_80.content.size_ = 10;
      name_80.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_23,name_80);
      local_848 = (ArrayPtr<const_char>)
                  DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                            ((Reader *)&_kjCondition_29);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x191,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_27,
                 (char (*) [15])"x structlist 2",(Reader *)&local_848);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    }
    local_800 = "x structlist 3";
    DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,2);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
    name_81.content.size_ = 10;
    name_81.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_23,name_81);
    local_848 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&_kjCondition_29);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_27,
               (DebugExpression<char_const(&)[15]> *)&local_800,(Reader *)&local_848);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    if ((_kjCondition_27.result == false) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,2);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&_kjCondition_23,(Reader *)&_kjCondition);
      name_82.content.size_ = 10;
      name_82.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_29,(Reader *)&_kjCondition_23,name_82);
      local_848 = (ArrayPtr<const_char>)
                  DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                            ((Reader *)&_kjCondition_29);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x192,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_27,
                 (char (*) [15])"x structlist 3",(Reader *)&local_848);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    }
    name_83.content.size_ = 9;
    name_83.content.ptr = "enumList";
    sVar11 = 9;
    DynamicStruct::Reader::get(&local_468,(Reader *)&_kjCondition_10,name_83);
    _kjCondition_29.op.content.size_ = (size_t)anon_var_dwarf_b94b2;
    _kjCondition_29._0_8_ = (long)"bazqux" + 3;
    _kjCondition_29.op.content.ptr = "bar";
    expected_13._M_len = sVar11;
    expected_13._M_array = (iterator)0x3;
    checkEnumList<capnp::DynamicValue::Reader>
              ((anon_unknown_133 *)&local_468,(Reader *)&_kjCondition_29,expected_13);
    DynamicValue::Reader::~Reader(&local_468);
    __kjCondition_10 = (uchar *)"corge";
    name_84.content.size_ = 10;
    name_84.content.ptr = "enumField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_84);
    DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
              ((Reader *)&_kjCondition_29);
    e_00.value._0_1_ = _kjCondition.left._0_1_;
    e_00.schema.super_Schema.raw = (Schema)(Schema)uStack_910;
    e_00.value._1_1_ = _kjCondition.left._1_1_;
    e_00._10_2_ = _kjCondition.left._2_2_;
    e_00._12_1_ = _kjCondition.left._4_1_;
    e_00._13_1_ = _kjCondition.left._5_1_;
    e_00._14_2_ = _kjCondition.left._6_2_;
    subSubReader._0_16_ = anon_unknown_133::name(e_00);
    kj::_::DebugExpression<char_const(&)[6]>::operator==
              ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition,
               (DebugExpression<char_const(&)[6]> *)&_kjCondition_10,(Reader *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
    name_85.content.size_ = 9;
    name_85.content.ptr = "voidList";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_85);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,(Reader *)&_kjCondition_29);
    subSubReader.reader.segment = (SegmentReader *)" == ";
    subSubReader.schema.super_Schema.raw = (Schema)0x500000006;
    subSubReader.reader.capTable = (CapTableReader *)&DAT_00000005;
    subSubReader.reader.data = (void *)((ulong)subSubReader.reader.data & 0xffffffffffffff00);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
    if (((char)subSubReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
      __kjCondition_10 = 6;
      name_86.content.size_ = 9;
      name_86.content.ptr = "voidList";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_86);
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicList> *)&_kjCondition,(Reader *)&_kjCondition_29);
      __kjCondition_23 = 5;
      kj::_::Debug::
      log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x198,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", _kjCondition, 6u, reader.get(\"voidList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (6u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
                 ,(DebugComparison<unsigned_int,_unsigned_int> *)&subSubReader,
                 (uint *)&_kjCondition_10,(uint *)&_kjCondition_23);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
    }
    name_87.content.size_ = 9;
    name_87.content.ptr = "boolList";
    sVar11 = 9;
    DynamicStruct::Reader::get(&local_4b0,&reader,name_87);
    _kjCondition_29.left = 0x1000001;
    expected_14._M_len = sVar11;
    expected_14._M_array = (iterator)&DAT_00000004;
    checkList<bool,capnp::DynamicValue::Reader>
              ((_ *)&local_4b0,(Reader *)&_kjCondition_29,expected_14);
    DynamicValue::Reader::~Reader(&local_4b0);
    name_88.content.size_ = 9;
    name_88.content.ptr = "int8List";
    sVar11 = 9;
    DynamicStruct::Reader::get(&local_4f8,&reader,name_88);
    _kjCondition_29.left._0_2_ = 0x916f;
    expected_15._M_len = sVar11;
    expected_15._M_array = (iterator)0x2;
    checkList<signed_char,capnp::DynamicValue::Reader>
              ((_ *)&local_4f8,(Reader *)&_kjCondition_29,expected_15);
    DynamicValue::Reader::~Reader(&local_4f8);
    name_89.content.size_ = 10;
    name_89.content.ptr = "int16List";
    sVar11 = 10;
    DynamicStruct::Reader::get(&local_540,&reader,name_89);
    _kjCondition_29.left = 0xd4992b67;
    expected_16._M_len = sVar11;
    expected_16._M_array = (iterator)0x2;
    checkList<short,capnp::DynamicValue::Reader>
              ((_ *)&local_540,(Reader *)&_kjCondition_29,expected_16);
    DynamicValue::Reader::~Reader(&local_540);
    name_90.content.size_ = 10;
    name_90.content.ptr = "int32List";
    sVar11 = 10;
    DynamicStruct::Reader::get(&local_588,&reader,name_90);
    _kjCondition_29.left = 0x69f6bc7;
    _kjCondition_29.right = 0xf9609439;
    expected_17._M_len = sVar11;
    expected_17._M_array = (iterator)0x2;
    checkList<int,capnp::DynamicValue::Reader>
              ((_ *)&local_588,(Reader *)&_kjCondition_29,expected_17);
    DynamicValue::Reader::~Reader(&local_588);
    name_91.content.size_ = 10;
    name_91.content.ptr = "int64List";
    sVar11 = 10;
    DynamicStruct::Reader::get(&local_5d0,&reader,name_91);
    _kjCondition_29.left = 0x2bc471c7;
    _kjCondition_29.right = 0xf6b75ab;
    _kjCondition_29.op.content.ptr = (char *)0xf0948a54d43b8e39;
    expected_18._M_len = sVar11;
    expected_18._M_array = (iterator)0x2;
    checkList<long,capnp::DynamicValue::Reader>
              ((_ *)&local_5d0,(Reader *)&_kjCondition_29,expected_18);
    DynamicValue::Reader::~Reader(&local_5d0);
    name_92.content.size_ = 10;
    name_92.content.ptr = "uInt8List";
    sVar11 = 10;
    DynamicStruct::Reader::get(&local_618,&reader,name_92);
    _kjCondition_29.left._0_2_ = 0xde6f;
    expected_19._M_len = sVar11;
    expected_19._M_array = (iterator)0x2;
    checkList<unsigned_char,capnp::DynamicValue::Reader>
              ((_ *)&local_618,(Reader *)&_kjCondition_29,expected_19);
    DynamicValue::Reader::~Reader(&local_618);
    name_93.content.size_ = 0xb;
    name_93.content.ptr = "uInt16List";
    sVar11 = 0xb;
    DynamicStruct::Reader::get(&local_660,&reader,name_93);
    _kjCondition_29.left = 0xad9c8235;
    expected_20._M_len = sVar11;
    expected_20._M_array = (iterator)0x2;
    checkList<unsigned_short,capnp::DynamicValue::Reader>
              ((_ *)&local_660,(Reader *)&_kjCondition_29,expected_20);
    DynamicValue::Reader::~Reader(&local_660);
    name_94.content.size_ = 0xb;
    name_94.content.ptr = "uInt32List";
    sVar11 = 0xb;
    DynamicStruct::Reader::get(&local_6a8,&reader,name_94);
    _kjCondition_29.left = 0xc6aea155;
    expected_21._M_len = sVar11;
    expected_21._M_array = (iterator)0x1;
    checkList<unsigned_int,capnp::DynamicValue::Reader>
              ((_ *)&local_6a8,(Reader *)&_kjCondition_29,expected_21);
    DynamicValue::Reader::~Reader(&local_6a8);
    name_95.content.size_ = 0xb;
    name_95.content.ptr = "uInt64List";
    sVar11 = 0xb;
    DynamicStruct::Reader::get(&local_6f0,&reader,name_95);
    _kjCondition_29.left = 0xb5ac71c7;
    _kjCondition_29.right = 0x9a3298af;
    expected_22._M_len = sVar11;
    expected_22._M_array = (iterator)0x1;
    checkList<unsigned_long,capnp::DynamicValue::Reader>
              ((_ *)&local_6f0,(Reader *)&_kjCondition_29,expected_22);
    DynamicValue::Reader::~Reader(&local_6f0);
    name_96.content.size_ = 0xc;
    name_96.content.ptr = "float32List";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_29,&reader,name_96);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,(Reader *)&_kjCondition_29);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_29);
    _kjCondition_29.left = 4;
    _kjCondition_29.right = 5;
    _kjCondition_29.op.content.ptr = " == ";
    _kjCondition_29.op.content.size_ = 5;
    _kjCondition_29._24_8_ = _kjCondition_29._24_8_ & 0xffffffffffffff00;
    __kjCondition_10 = 4;
    __kjCondition_23 = 5;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)&subSubReader,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a4,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               &_kjCondition_29,(uint *)&_kjCondition_10,(uint *)&_kjCondition_23);
    kj::_::Debug::Fault::fatal((Fault *)&subSubReader);
  }
  __kjCondition_23 = 3;
  _kjCondition_27.left._0_4_ = subSubReader.reader.dataSize;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,399,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
             &_kjCondition_29,(uint *)&_kjCondition_23,(uint *)&_kjCondition_27);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

void dynamicCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(true, reader.get("boolField").as<bool>());
  EXPECT_EQ(-123, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(-12345, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(-12345678, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(-123456789012345ll, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(234u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(45678u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(3456789012u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(12345678901234567890ull, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(1234.5f, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(-123e45, reader.get("float64Field").as<double>());
  EXPECT_EQ("foo", reader.get("textField").as<Text>());
  EXPECT_EQ(data("bar"), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(true, subReader.get("boolField").as<bool>());
    EXPECT_EQ(-12, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(3456, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(-78901234, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(56789012345678ll, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(90u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(1234u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(56789012u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(345678901234567890ull, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(345, subReader.get("float64Field").as<double>());
    EXPECT_EQ("baz", subReader.get("textField").as<Text>());
    EXPECT_EQ(data("qux"), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("nested", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("really nested", subSubReader.get("structField").as<DynamicStruct>()
                                             .get("textField").as<Text>());
    }
    EXPECT_EQ("baz", name(subReader.get("enumField").as<DynamicEnum>()));

    checkList<Void>(subReader.get("voidList"), {VOID, VOID, VOID});
    checkList<bool>(subReader.get("boolList"), {false, true, false, true, true});
    checkList<int8_t>(subReader.get("int8List"), {12, -34, -0x80, 0x7f});
    checkList<int16_t>(subReader.get("int16List"), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList<int32_t>(subReader.get("int32List"), {12345678, -90123456, -0x7fffffff-1, 0x7fffffff});
    checkList<int64_t>(subReader.get("int64List"), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList<uint8_t>(subReader.get("uInt8List"), {12u, 34u, 0u, 0xffu});
    checkList<uint16_t>(subReader.get("uInt16List"), {1234u, 5678u, 0u, 0xffffu});
    checkList<uint32_t>(subReader.get("uInt32List"), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList<uint64_t>(subReader.get("uInt64List"), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList<float>(subReader.get("float32List"), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList<double>(subReader.get("float64List"), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList<Text>(subReader.get("textList"), {"quux", "corge", "grault"});
    checkList<Data>(subReader.get("dataList"), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.get("structList").as<DynamicList>();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
    }
    checkEnumList(subReader.get("enumList"), {"qux", "bar", "grault"});
  }
  EXPECT_EQ("corge", name(reader.get("enumField").as<DynamicEnum>()));

  EXPECT_EQ(6u, reader.get("voidList").as<DynamicList>().size());
  checkList<bool>(reader.get("boolList"), {true, false, false, true});
  checkList<int8_t>(reader.get("int8List"), {111, -111});
  checkList<int16_t>(reader.get("int16List"), {11111, -11111});
  checkList<int32_t>(reader.get("int32List"), {111111111, -111111111});
  checkList<int64_t>(reader.get("int64List"), {1111111111111111111ll, -1111111111111111111ll});
  checkList<uint8_t>(reader.get("uInt8List"), {111u, 222u});
  checkList<uint16_t>(reader.get("uInt16List"), {33333u, 44444u});
  checkList<uint32_t>(reader.get("uInt32List"), {3333333333u});
  checkList<uint64_t>(reader.get("uInt64List"), {11111111111111111111ull});
  {
    auto listReader = reader.get("float32List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0].as<float>());
    EXPECT_EQ(kj::inf(), listReader[1].as<float>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<float>());
    EXPECT_TRUE(isNaN(listReader[3].as<float>()));
  }
  {
    auto listReader = reader.get("float64List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0].as<double>());
    EXPECT_EQ(kj::inf(), listReader[1].as<double>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<double>());
    EXPECT_TRUE(isNaN(listReader[3].as<double>()));
  }
  checkList<Text>(reader.get("textList"), {"plugh", "xyzzy", "thud"});
  checkList<Data>(reader.get("dataList"), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.get("structList").as<DynamicList>();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
  }
  checkEnumList(reader.get("enumList"), {"foo", "garply"});
}